

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# line_info.cc
# Opt level: O3

string * __thiscall
bloaty::dwarf::LineInfoReader::GetExpandedFilename_abi_cxx11_(LineInfoReader *this,size_t index)

{
  string *this_00;
  uint uVar1;
  pointer pbVar2;
  pointer pFVar3;
  char *pcVar4;
  pointer pbVar5;
  size_type __new_size;
  long *local_48 [2];
  long local_38 [2];
  
  __new_size = ((long)(this->filenames_).
                      super__Vector_base<bloaty::dwarf::LineInfoReader::FileName,_std::allocator<bloaty::dwarf::LineInfoReader::FileName>_>
                      ._M_impl.super__Vector_impl_data._M_finish -
                (long)(this->filenames_).
                      super__Vector_base<bloaty::dwarf::LineInfoReader::FileName,_std::allocator<bloaty::dwarf::LineInfoReader::FileName>_>
                      ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333;
  if (index <= __new_size && __new_size - index != 0) {
    pbVar5 = (this->expanded_filenames_).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(this->expanded_filenames_).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)pbVar5 >> 5) <= index) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::resize(&this->expanded_filenames_,__new_size);
      pbVar5 = (this->expanded_filenames_).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
    }
    this_00 = pbVar5 + index;
    if (pbVar5[index]._M_string_length == 0) {
      pbVar2 = (this->include_directories_).
               super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pFVar3 = (this->filenames_).
               super__Vector_base<bloaty::dwarf::LineInfoReader::FileName,_std::allocator<bloaty::dwarf::LineInfoReader::FileName>_>
               ._M_impl.super__Vector_impl_data._M_start;
      uVar1 = pFVar3[index].directory_index;
      pcVar4 = pbVar2[uVar1]._M_str;
      local_48[0] = local_38;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_48,pcVar4,pcVar4 + pbVar2[uVar1]._M_len);
      std::__cxx11::string::operator=((string *)this_00,(string *)local_48);
      if (local_48[0] != local_38) {
        operator_delete(local_48[0],local_38[0] + 1);
      }
      pFVar3 = pFVar3 + index;
      if (this_00->_M_string_length != 0) {
        std::__cxx11::string::append((char *)this_00);
      }
      pcVar4 = (pFVar3->name)._M_str;
      local_48[0] = local_38;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)local_48,pcVar4,pcVar4 + (pFVar3->name)._M_len);
      std::__cxx11::string::_M_append((char *)this_00,(ulong)local_48[0]);
      if (local_48[0] != local_38) {
        operator_delete(local_48[0],local_38[0] + 1);
      }
    }
    return this_00;
  }
  Throw("filename index out of range",0x1f);
}

Assistant:

const std::string& LineInfoReader::GetExpandedFilename(size_t index) {
  if (index >= filenames_.size()) {
    THROW("filename index out of range");
  }

  // Generate these lazily.
  if (expanded_filenames_.size() <= index) {
    expanded_filenames_.resize(filenames_.size());
  }

  std::string& ret = expanded_filenames_[index];
  if (ret.empty()) {
    const FileName& filename = filenames_[index];
    std::string_view directory = include_directories_[filename.directory_index];
    ret = std::string(directory);
    if (!ret.empty()) {
      ret += "/";
    }
    ret += std::string(filename.name);
  }
  return ret;
}